

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-socket-buffer-size.c
# Opt level: O2

int run_test_socket_buffer_size(void)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init(uVar2,&tcp);
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_tcp_bind(&tcp,&addr,0);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        check_buffer_size((uv_handle_t *)&tcp);
        uv_close(&tcp,close_cb);
        uVar2 = uv_default_loop();
        iVar1 = uv_udp_init(uVar2,&udp);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a == 0) {
          iVar1 = uv_udp_bind(&udp,&addr,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a == 0) {
            check_buffer_size((uv_handle_t *)&udp);
            uv_close(&udp,close_cb);
            uVar2 = uv_default_loop();
            iVar1 = uv_run(uVar2,0);
            eval_a = (int64_t)iVar1;
            eval_b = 0;
            if (eval_a == 0) {
              eval_a = 2;
              eval_b = (int64_t)close_cb_called;
              if (eval_b == 2) {
                uVar2 = uv_default_loop();
                uv_walk(uVar2,close_walk_cb,0);
                uv_run(uVar2,0);
                eval_a = 0;
                uVar2 = uv_default_loop();
                iVar1 = uv_loop_close(uVar2);
                eval_b = (int64_t)iVar1;
                if (eval_b == 0) {
                  uv_library_shutdown();
                  return 0;
                }
                pcVar4 = "uv_loop_close(uv_default_loop())";
                pcVar3 = "0";
                uVar2 = 0x4b;
              }
              else {
                pcVar4 = "close_cb_called";
                pcVar3 = "2";
                uVar2 = 0x49;
              }
            }
            else {
              pcVar4 = "0";
              pcVar3 = "uv_run(uv_default_loop(), UV_RUN_DEFAULT)";
              uVar2 = 0x47;
            }
          }
          else {
            pcVar4 = "0";
            pcVar3 = "uv_udp_bind(&udp, (struct sockaddr*) &addr, 0)";
            uVar2 = 0x43;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "uv_udp_init(uv_default_loop(), &udp)";
          uVar2 = 0x42;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0)";
        uVar2 = 0x3e;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "uv_tcp_init(uv_default_loop(), &tcp)";
      uVar2 = 0x3d;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
    uVar2 = 0x3b;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-socket-buffer-size.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(socket_buffer_size) {
  struct sockaddr_in addr;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  ASSERT_OK(uv_tcp_init(uv_default_loop(), &tcp));
  ASSERT_OK(uv_tcp_bind(&tcp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &tcp);
  uv_close((uv_handle_t*) &tcp, close_cb);

  ASSERT_OK(uv_udp_init(uv_default_loop(), &udp));
  ASSERT_OK(uv_udp_bind(&udp, (struct sockaddr*) &addr, 0));
  check_buffer_size((uv_handle_t*) &udp);
  uv_close((uv_handle_t*) &udp, close_cb);

  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));

  ASSERT_EQ(2, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}